

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O0

Iterator __thiscall
axl::sl::
ListBase<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>_>
::insertTail(ListBase<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>_>
             *this,SerialPortDesc *p)

{
  Link *this_00;
  SerialPortDesc *in_RSI;
  SerialPortDesc *in_RDI;
  ListLink *tailLink;
  ListLink *link;
  Entry *in_stack_ffffffffffffffd0;
  ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink> local_21;
  ListLink *local_20;
  SerialPortDesc *local_18;
  IteratorImpl<axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::io::SerialPortDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>
  local_8;
  
  local_18 = in_RSI;
  local_20 = ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>::operator()
                       (&local_21,in_RSI);
  this_00 = IteratorBase<axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::io::SerialPortDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>
            ::getLinkFromEntry(in_stack_ffffffffffffffd0);
  local_20->m_next = (ListLink *)0x0;
  local_20->m_prev = this_00;
  if (this_00 == (Link *)0x0) {
    (in_RDI->super_ListLink).m_next = &local_18->super_ListLink;
  }
  else {
    this_00->m_next = local_20;
  }
  (in_RDI->super_ListLink).m_prev = &local_18->super_ListLink;
  (in_RDI->m_deviceName).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p =
       (in_RDI->m_deviceName).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p + 1;
  Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>
  ::Iterator((Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>
              *)this_00,in_RDI);
  return (Iterator)
         local_8.
         super_IteratorBase<axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::io::SerialPortDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>
         .m_p;
}

Assistant:

Iterator
	insertTail(T* p) {
		ListLink* link = GetLink()(p);
		ListLink* tailLink = Iterator::getLinkFromEntry(this->m_tail);

		link->m_next = NULL;
		link->m_prev = tailLink;

		if (tailLink)
			tailLink->m_next = link;
		else
			this->m_head = p;

		this->m_tail = p;
		this->m_count++;

		return p;
	}